

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall
flatbuffers::ts::TsGenerator::GenerateFinisher
          (TsGenerator *this,StructDef *struct_def,string *code_ptr,string *code,bool size_prefixed)

{
  size_type *psVar1;
  Parser *pPVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  string sizePrefixed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ != struct_def) {
    return;
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SizePrefixed","");
  GenDocComment(code_ptr);
  local_50[0] = local_40;
  if (size_prefixed) {
    std::__cxx11::string::_M_construct<char*>((string *)local_50,local_70,local_68 + (long)local_70)
    ;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50);
  }
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3781bc);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_a0 = *puVar5;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar5;
    local_b0 = (ulong *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_90,"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
  uVar7 = 0xf;
  if (local_b0 != &local_a0) {
    uVar7 = local_a0;
  }
  if (uVar7 < local_90._M_string_length + local_a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_a8 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00265944;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
LAB_00265944:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_f0.field_2._M_allocated_capacity = *psVar1;
    local_f0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar1;
    local_f0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_f0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  pPVar2 = (this->super_BaseGenerator).parser_;
  if ((pPVar2->file_identifier_)._M_string_length != 0) {
    std::operator+(&local_f0,", \'",&pPVar2->file_identifier_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  if (size_prefixed) {
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::append((char *)code);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void GenerateFinisher(StructDef &struct_def, std::string *code_ptr,
                        std::string &code, bool size_prefixed) {
    if (parser_.root_struct_def_ == &struct_def) {
      std::string sizePrefixed("SizePrefixed");
      GenDocComment(code_ptr);

      code += "static finish" + (size_prefixed ? sizePrefixed : "") +
              GetPrefixedName(struct_def) + "Buffer";
      code += "(builder:flatbuffers.Builder, offset:flatbuffers.Offset) {\n";
      code += "  builder.finish(offset";
      if (!parser_.file_identifier_.empty()) {
        code += ", '" + parser_.file_identifier_ + "'";
      }
      if (size_prefixed) {
        if (parser_.file_identifier_.empty()) { code += ", undefined"; }
        code += ", true";
      }
      code += ");\n";
      code += "}\n\n";
    }
  }